

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_keyword_range_fn.hpp
# Opt level: O0

object boost::python::detail::
       make_keyword_range_constructor<boost::mpl::vector0<mpl_::na>,boost::mpl::size<boost::mpl::vector0<mpl_::na>>,boost::python::objects::value_holder<HighFreqDataType>,boost::python::default_call_policies>
                 (default_call_policies *policies,keyword_range *kw,
                 value_holder<HighFreqDataType> *param_3,vector0<mpl_::na> *param_4,
                 size<boost::mpl::vector0<mpl_::na>_> *param_5)

{
  keyword_range *in_RDX;
  default_call_policies *in_RSI;
  object_base in_RDI;
  
  make_keyword_range_function<void(*)(_object*),boost::python::default_call_policies>
            ((_func_void__object_ptr *)in_RDI.m_ptr,in_RSI,in_RDX);
  return (object)(object_base)in_RDI.m_ptr;
}

Assistant:

object make_keyword_range_constructor(
    CallPolicies const& policies        // The CallPolicies with which to invoke the Holder's constructor
    , detail::keyword_range const& kw   // The (possibly empty) set of associated argument keywords
    , Holder* = 0                       
    , ArgList* = 0, Arity* = 0)
{
#if !defined( BOOST_PYTHON_NO_PY_SIGNATURES) && defined( BOOST_PYTHON_PY_SIGNATURES_PROPER_INIT_SELF_TYPE)
    python_class<BOOST_DEDUCED_TYPENAME Holder::value_type>::register_();
#endif
    return detail::make_keyword_range_function(
        objects::make_holder<Arity::value>
            ::template apply<Holder,ArgList>::execute
        , policies
        , kw);
}